

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::HandleTestModelArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  bool bVar6;
  char *in_R8;
  string *s;
  string_view varg1;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  size_t local_1a0;
  
  varg1._M_str = "--test-model";
  varg1._M_len = (size_t)"-M";
  bVar3 = CheckArgument((cmCTest *)
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + *i),(string *)0x2,varg1,in_R8)
  ;
  bVar6 = true;
  if (bVar3) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar4 = *i + 1;
      *i = sVar4;
      s = pbVar1 + sVar4;
      cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,s);
      __y._M_str = "nightly";
      __y._M_len = 7;
      __x._M_str = _cmCTestLog_msg;
      __x._M_len = local_1a0;
      bVar3 = std::operator==(__x,__y);
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if (bVar3) {
        _Var2._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
        (_Var2._M_head_impl)->InteractiveDebugMode = false;
        (_Var2._M_head_impl)->TestModel = 1;
      }
      else {
        cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,s);
        __y_00._M_str = "continuous";
        __y_00._M_len = 10;
        __x_00._M_str = _cmCTestLog_msg;
        __x_00._M_len = local_1a0;
        bVar3 = std::operator==(__x_00,__y_00);
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        if (bVar3) {
          _Var2._M_head_impl =
               (this->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          (_Var2._M_head_impl)->InteractiveDebugMode = false;
          (_Var2._M_head_impl)->TestModel = 2;
        }
        else {
          cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,s);
          __y_01._M_str = "experimental";
          __y_01._M_len = 0xc;
          __x_01._M_str = _cmCTestLog_msg;
          __x_01._M_len = local_1a0;
          bVar3 = std::operator==(__x_01,__y_01);
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          if (bVar3) {
            _Var2._M_head_impl =
                 (this->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            (_Var2._M_head_impl)->InteractiveDebugMode = false;
            (_Var2._M_head_impl)->TestModel = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,
                                     "CTest -M called with incorrect option: ");
            poVar5 = std::operator<<(poVar5,(string *)s);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__cxx11::stringbuf::str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0xb25,local_1c8[0],false);
            std::__cxx11::string::~string((string *)local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Available options are:");
            poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,ctestExec);
            poVar5 = std::operator<<(poVar5," -M Continuous");
            poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,ctestExec);
            poVar5 = std::operator<<(poVar5," -M Experimental");
            poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
            poVar5 = std::operator<<(poVar5,"  ");
            poVar5 = std::operator<<(poVar5,ctestExec);
            poVar5 = std::operator<<(poVar5," -M Nightly");
            std::endl<char,std::char_traits<char>>(poVar5);
            std::__cxx11::stringbuf::str();
            Log(this,7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                ,0xb2b,local_1c8[0],false);
            std::__cxx11::string::~string((string *)local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            bVar6 = false;
          }
        }
      }
    }
  }
  return bVar6;
}

Assistant:

bool cmCTest::HandleTestModelArgument(const char* ctestExec, size_t& i,
                                      const std::vector<std::string>& args)
{
  bool success = true;
  std::string const& arg = args[i];
  if (this->CheckArgument(arg, "-M"_s, "--test-model") &&
      (i < args.size() - 1)) {
    i++;
    std::string const& str = args[i];
    if (cmSystemTools::LowerCase(str) == "nightly"_s) {
      this->SetTestModel(cmCTest::NIGHTLY);
    } else if (cmSystemTools::LowerCase(str) == "continuous"_s) {
      this->SetTestModel(cmCTest::CONTINUOUS);
    } else if (cmSystemTools::LowerCase(str) == "experimental"_s) {
      this->SetTestModel(cmCTest::EXPERIMENTAL);
    } else {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE,
                 "CTest -M called with incorrect option: " << str
                                                           << std::endl);
      cmCTestLog(this, ERROR_MESSAGE,
                 "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -M Continuous" << std::endl
                   << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
    }
  }
  return success;
}